

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

void libyuv::ScaleAddCols0_C
               (int dst_width,int boxheight,int x,int dx,uint16_t *src_ptr,uint8_t *dst_ptr)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)dst_width;
  if (dst_width < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dst_ptr[uVar2] =
         (uint8_t)((uint)src_ptr[(long)(x >> 0x10) + uVar2] * (int)(0x10000 / (long)boxheight) >>
                  0x10);
  }
  return;
}

Assistant:

static void ScaleAddCols0_C(int dst_width,
                            int boxheight,
                            int x,
                            int dx,
                            const uint16_t* src_ptr,
                            uint8_t* dst_ptr) {
  int scaleval = 65536 / boxheight;
  int i;
  (void)dx;
  src_ptr += (x >> 16);
  for (i = 0; i < dst_width; ++i) {
    *dst_ptr++ = src_ptr[i] * scaleval >> 16;
  }
}